

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traceback.c
# Opt level: O1

parasail_traceback_t *
parasail_result_get_traceback_extra
          (parasail_result_t *result,char *seqA,int lena,char *seqB,int lenb,
          parasail_matrix_t *matrix,char match,char pos,char neg,int case_sensitive,
          char *alphabet_aliases)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  __int32_t **pp_Var10;
  parasail_traceback_t *ppVar11;
  char cVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  int *piVar16;
  char cVar17;
  uint uVar18;
  char *pcVar19;
  char *pcVar20;
  ulong uVar21;
  byte bVar22;
  size_t sVar23;
  char *pcVar24;
  char *pcVar25;
  ulong uVar26;
  size_t sVar27;
  char *pcVar28;
  char *pcVar29;
  bool bVar30;
  char *local_190;
  char *local_188;
  char *local_180;
  byte abStack_138 [264];
  
  iVar7 = parasail_result_is_trace(result);
  if (iVar7 == 0) {
    parasail_result_get_traceback_extra_cold_26();
LAB_00548fcd:
    ppVar11 = (parasail_traceback_t *)0x0;
  }
  else {
    uVar3 = result->flag;
    if ((uVar3 & 0xc00) == 0) {
      sVar23 = (size_t)(lena + lenb + 1);
      local_180 = (char *)malloc(sVar23);
      local_188 = (char *)malloc(sVar23);
      local_190 = (char *)malloc(sVar23);
      iVar7 = result->end_query;
      uVar26 = (ulong)iVar7;
      iVar4 = result->end_ref;
      uVar21 = (ulong)iVar4;
      piVar5 = ((result->field_4).rowcols)->score_row;
      if (alphabet_aliases == (char *)0x0) {
        sVar23 = 0;
      }
      else {
        sVar23 = strlen(alphabet_aliases);
        if ((sVar23 & 0xffffffffffffff01) == 0) {
          if (sVar23 != 0) {
            sVar27 = 0;
            do {
              if (case_sensitive == 0) {
                pp_Var10 = __ctype_toupper_loc();
                bVar22 = *(byte *)(*pp_Var10 + alphabet_aliases[sVar27]);
              }
              else {
                bVar22 = alphabet_aliases[sVar27];
              }
              abStack_138[sVar27] = bVar22;
              sVar27 = sVar27 + 1;
            } while (sVar23 != sVar27);
          }
        }
        else {
          parasail_result_get_traceback_extra_cold_21();
        }
        if ((sVar23 & 0xffffffffffffff01) != 0) goto LAB_00548fcd;
      }
      pcVar19 = local_188;
      pcVar24 = local_180;
      pcVar28 = local_190;
      if ((result->flag & 2) != 0) {
        if (result->end_query + 1 == lena) {
          bVar30 = true;
          if (iVar4 < lenb + -1) {
            sVar27 = (ulong)((lenb - iVar4) - 2) + 1;
            memset(local_180,0x2d,sVar27);
            memset(local_190,0x20,sVar27);
            lVar9 = (long)(lenb + -1);
            lVar8 = lVar9 - uVar21;
            do {
              *pcVar19 = seqB[lVar9];
              pcVar19 = pcVar19 + 1;
              lVar9 = lVar9 + -1;
            } while ((long)uVar21 < lVar9);
            pcVar24 = local_180 + lVar8;
            pcVar28 = local_190 + lVar8;
            bVar30 = true;
          }
        }
        else if (result->end_ref + 1 == lenb) {
          bVar30 = true;
          if (iVar7 < lena + -1) {
            lVar8 = (long)(lena + -1);
            do {
              if (seqA == (char *)0x0) {
                cVar12 = '*';
              }
              else {
                cVar12 = seqA[lVar8];
              }
              *pcVar24 = cVar12;
              pcVar24 = pcVar24 + 1;
              *pcVar19 = '-';
              pcVar19 = pcVar19 + 1;
              *pcVar28 = ' ';
              pcVar28 = pcVar28 + 1;
              lVar8 = lVar8 + -1;
              bVar30 = true;
            } while ((long)uVar26 < lVar8);
          }
        }
        else {
          parasail_result_get_traceback_extra_cold_22();
          bVar30 = false;
        }
        if (!bVar30) goto LAB_00548fcd;
      }
      cVar12 = '\x04';
      do {
        pcVar20 = pcVar19;
        pcVar25 = pcVar24;
        pcVar29 = pcVar28;
        if ((long)(uVar26 & uVar21) < 0) goto LAB_00547e5b;
        if ((long)uVar26 < 0) {
          iVar7 = 0xe;
          if ((result->flag & 4) == 0 && -1 < (long)uVar21) {
            lVar8 = uVar21 + 1;
            do {
              *pcVar24 = '-';
              pcVar24 = pcVar24 + 1;
              *pcVar19 = seqB[lVar8 + -1];
              pcVar19 = pcVar19 + 1;
              *pcVar28 = ' ';
              pcVar28 = pcVar28 + 1;
              lVar8 = lVar8 + -1;
            } while (0 < lVar8);
            uVar21 = 0xffffffffffffffff;
            pcVar20 = pcVar19;
            pcVar25 = pcVar24;
            pcVar29 = pcVar28;
          }
        }
        else if ((long)uVar21 < 0) {
          iVar7 = 0xe;
          if ((-1 < (long)uVar26) && ((result->flag & 4U) == 0)) {
            lVar8 = uVar26 + 1;
            lVar9 = uVar26 << 0x20;
            do {
              if (seqA == (char *)0x0) {
                cVar17 = '*';
              }
              else {
                cVar17 = seqA[lVar9 >> 0x20];
              }
              *pcVar24 = cVar17;
              pcVar24 = pcVar24 + 1;
              *pcVar19 = '-';
              pcVar19 = pcVar19 + 1;
              *pcVar28 = ' ';
              pcVar28 = pcVar28 + 1;
              lVar8 = lVar8 + -1;
              lVar9 = lVar9 + -0x100000000;
            } while (0 < lVar8);
            uVar26 = 0xffffffffffffffff;
            pcVar20 = pcVar19;
            pcVar25 = pcVar24;
            pcVar29 = pcVar28;
          }
        }
        else {
          lVar8 = uVar26 * (long)lenb + uVar21;
          if (cVar12 == '\x01') {
            *pcVar24 = '-';
            *pcVar19 = seqB[uVar21];
            *pcVar28 = ' ';
            uVar21 = uVar21 - 1;
            iVar7 = 0;
            cVar12 = '\x04';
            pcVar20 = pcVar19 + 1;
            pcVar25 = pcVar24 + 1;
            pcVar29 = pcVar28 + 1;
            if (((*(byte *)((long)piVar5 + lVar8) & 8) == 0) &&
               (cVar12 = '\x01', (*(byte *)((long)piVar5 + lVar8) & 0x10) == 0)) {
              parasail_result_get_traceback_extra_cold_24();
              cVar12 = '\x01';
LAB_00547cf9:
              iVar7 = 1;
              pcVar20 = pcVar19 + 1;
              pcVar25 = pcVar24 + 1;
              pcVar29 = pcVar28 + 1;
            }
          }
          else {
            iVar7 = (int)uVar26;
            if (cVar12 == '\x02') {
              if (seqA == (char *)0x0) {
                cVar12 = '*';
              }
              else {
                cVar12 = seqA[iVar7];
              }
              *pcVar24 = cVar12;
              *pcVar19 = '-';
              *pcVar28 = ' ';
              uVar26 = uVar26 - 1;
              cVar12 = '\x04';
              pcVar20 = pcVar19 + 1;
              pcVar25 = pcVar24 + 1;
              pcVar29 = pcVar28 + 1;
              iVar7 = 0;
              if (((*(byte *)((long)piVar5 + lVar8) & 0x20) == 0) &&
                 (cVar12 = '\x02', iVar7 = 0, (*(byte *)((long)piVar5 + lVar8) & 0x40) == 0)) {
                parasail_result_get_traceback_extra_cold_23();
                cVar12 = '\x02';
                goto LAB_00547cf9;
              }
            }
            else if (cVar12 == '\x04') {
              bVar22 = *(byte *)((long)piVar5 + lVar8);
              if ((bVar22 & 4) == 0) {
                if ((bVar22 & 1) == 0) {
                  bVar30 = (bVar22 & 2) == 0;
                  cVar12 = bVar30 * '\x02' + '\x02';
                  iVar7 = 0;
                  if (bVar30) {
                    iVar7 = 0xe;
                  }
                }
                else {
                  cVar12 = '\x01';
                  iVar7 = 0;
                }
              }
              else {
                bVar22 = 0x2a;
                cVar12 = '*';
                if (seqA != (char *)0x0) {
                  cVar12 = seqA[iVar7];
                }
                *pcVar24 = cVar12;
                *pcVar19 = seqB[uVar21];
                if (seqA != (char *)0x0) {
                  bVar22 = seqA[iVar7];
                }
                bVar1 = seqB[uVar21 & 0xffffffff];
                if (case_sensitive == 0) {
                  pp_Var10 = __ctype_toupper_loc();
                  bVar30 = (*pp_Var10)[(char)bVar22] == (*pp_Var10)[(char)bVar1];
                }
                else {
                  bVar30 = bVar22 == bVar1;
                }
                if (sVar23 != 0) {
                  sVar27 = 0;
                  do {
                    if (abStack_138[sVar27] == bVar22) {
                      bVar30 = (bool)(bVar30 | abStack_138[sVar27 + 1] == bVar1);
                    }
                    else if (abStack_138[sVar27 + 1] == bVar22) {
                      bVar30 = (bool)(bVar30 | abStack_138[sVar27] == bVar1);
                    }
                    sVar27 = sVar27 + 1;
                  } while (sVar23 != sVar27);
                }
                cVar12 = match;
                if (!bVar30) {
                  if (matrix->type == 0) {
                    piVar16 = matrix->mapper;
                    iVar7 = matrix->size * piVar16[bVar22];
                  }
                  else {
                    iVar7 = matrix->size * iVar7;
                    piVar16 = matrix->mapper;
                  }
                  cVar12 = neg;
                  if (0 < matrix->matrix[iVar7 + piVar16[bVar1]]) {
                    cVar12 = pos;
                  }
                }
                *pcVar28 = cVar12;
                uVar26 = uVar26 - 1;
                uVar21 = uVar21 - 1;
                iVar7 = 0;
                cVar12 = '\x04';
                pcVar20 = pcVar19 + 1;
                pcVar25 = pcVar24 + 1;
                pcVar29 = pcVar28 + 1;
              }
            }
            else {
              parasail_result_get_traceback_extra_cold_25();
              cVar12 = '\x03';
              iVar7 = 1;
            }
          }
        }
        pcVar19 = pcVar20;
        pcVar24 = pcVar25;
        pcVar28 = pcVar29;
      } while (iVar7 == 0);
      if (iVar7 != 0xe) goto LAB_00548fcd;
LAB_00547e5b:
      *pcVar25 = '\0';
      *pcVar20 = '\0';
      *pcVar29 = '\0';
      ppVar11 = (parasail_traceback_t *)malloc(0x18);
      sVar23 = strlen(local_180);
      pcVar19 = parasail_reverse(local_180,sVar23);
      ppVar11->query = pcVar19;
      sVar23 = strlen(local_190);
      pcVar19 = parasail_reverse(local_190,sVar23);
      ppVar11->comp = pcVar19;
    }
    else {
      if ((uVar3 >> 0x14 & 1) == 0) {
        if ((uVar3 >> 0x15 & 1) == 0) {
          if ((uVar3 >> 0x16 & 1) == 0) {
            if ((uVar3 >> 0x17 & 1) == 0) goto LAB_00548fcd;
            sVar23 = (size_t)(lena + lenb + 1);
            local_180 = (char *)malloc(sVar23);
            local_188 = (char *)malloc(sVar23);
            local_190 = (char *)malloc(sVar23);
            iVar7 = result->end_query;
            uVar21 = (ulong)iVar7;
            iVar4 = result->end_ref;
            uVar26 = (ulong)iVar4;
            uVar18 = 2;
            if ((uVar3 >> 0x19 & 1) == 0) {
              uVar18 = uVar3 >> 0x18 & 1;
            }
            uVar13 = 4;
            if ((uVar3 >> 0x1a & 1) == 0) {
              uVar13 = uVar18;
            }
            uVar18 = 8;
            if ((uVar3 >> 0x1b & 1) == 0) {
              uVar18 = uVar13;
            }
            uVar13 = 0x10;
            if ((uVar3 >> 0x1c & 1) == 0) {
              uVar13 = uVar18;
            }
            uVar18 = 0x20;
            if ((uVar3 >> 0x1d & 1) == 0) {
              uVar18 = uVar13;
            }
            uVar14 = 0x40;
            if ((uVar3 >> 0x1e & 1) == 0) {
              uVar14 = (ulong)uVar18;
            }
            piVar5 = ((result->field_4).rowcols)->score_row;
            lVar8 = (long)((long)lena + uVar14 + -1) / (long)uVar14;
            if (alphabet_aliases == (char *)0x0) {
              sVar23 = 0;
            }
            else {
              sVar23 = strlen(alphabet_aliases);
              if ((sVar23 & 0xffffffffffffff01) == 0) {
                if (sVar23 != 0) {
                  sVar27 = 0;
                  do {
                    if (case_sensitive == 0) {
                      pp_Var10 = __ctype_toupper_loc();
                      bVar22 = *(byte *)(*pp_Var10 + alphabet_aliases[sVar27]);
                    }
                    else {
                      bVar22 = alphabet_aliases[sVar27];
                    }
                    abStack_138[sVar27] = bVar22;
                    sVar27 = sVar27 + 1;
                  } while (sVar23 != sVar27);
                }
              }
              else {
                parasail_result_get_traceback_extra_cold_16();
              }
              if ((sVar23 & 0xffffffffffffff01) != 0) goto LAB_00548fcd;
            }
            pcVar19 = local_188;
            pcVar24 = local_190;
            pcVar28 = local_180;
            if ((result->flag & 2) != 0) {
              if (result->end_query + 1 == lena) {
                bVar30 = true;
                if (iVar4 < lenb + -1) {
                  sVar27 = (ulong)((lenb - iVar4) - 2) + 1;
                  memset(local_180,0x2d,sVar27);
                  memset(local_190,0x20,sVar27);
                  lVar15 = (long)(lenb + -1);
                  lVar9 = lVar15 - uVar26;
                  do {
                    *pcVar19 = seqB[lVar15];
                    pcVar19 = pcVar19 + 1;
                    lVar15 = lVar15 + -1;
                  } while ((long)uVar26 < lVar15);
                  pcVar24 = local_190 + lVar9;
                  pcVar28 = local_180 + lVar9;
                  bVar30 = true;
                }
              }
              else if (result->end_ref + 1 == lenb) {
                bVar30 = true;
                if (iVar7 < lena + -1) {
                  lVar9 = (long)(lena + -1);
                  do {
                    if (seqA == (char *)0x0) {
                      cVar12 = '*';
                    }
                    else {
                      cVar12 = seqA[lVar9];
                    }
                    *pcVar28 = cVar12;
                    pcVar28 = pcVar28 + 1;
                    *pcVar19 = '-';
                    pcVar19 = pcVar19 + 1;
                    *pcVar24 = ' ';
                    pcVar24 = pcVar24 + 1;
                    lVar9 = lVar9 + -1;
                    bVar30 = true;
                  } while ((long)uVar21 < lVar9);
                }
              }
              else {
                parasail_result_get_traceback_extra_cold_17();
                bVar30 = false;
              }
              if (!bVar30) goto LAB_00548fcd;
            }
            cVar12 = '\x04';
            do {
              if ((long)(uVar21 & uVar26) < 0) goto LAB_00548f48;
              pcVar20 = pcVar19;
              pcVar25 = pcVar24;
              pcVar29 = pcVar28;
              if ((long)uVar21 < 0) {
                iVar7 = 0xe;
                if ((result->flag & 4) == 0 && -1 < (long)uVar26) {
                  lVar9 = uVar26 + 1;
                  do {
                    *pcVar28 = '-';
                    pcVar28 = pcVar28 + 1;
                    *pcVar19 = seqB[lVar9 + -1];
                    pcVar19 = pcVar19 + 1;
                    *pcVar24 = ' ';
                    pcVar24 = pcVar24 + 1;
                    lVar9 = lVar9 + -1;
                  } while (0 < lVar9);
                  uVar26 = 0xffffffffffffffff;
                  pcVar20 = pcVar19;
                  pcVar25 = pcVar24;
                  pcVar29 = pcVar28;
                }
              }
              else if ((long)uVar26 < 0) {
                iVar7 = 0xe;
                if ((-1 < (long)uVar21) && ((result->flag & 4U) == 0)) {
                  lVar9 = uVar21 + 1;
                  lVar15 = uVar21 << 0x20;
                  do {
                    if (seqA == (char *)0x0) {
                      cVar17 = '*';
                    }
                    else {
                      cVar17 = seqA[lVar15 >> 0x20];
                    }
                    *pcVar28 = cVar17;
                    pcVar28 = pcVar28 + 1;
                    *pcVar19 = '-';
                    pcVar19 = pcVar19 + 1;
                    *pcVar24 = ' ';
                    pcVar24 = pcVar24 + 1;
                    lVar9 = lVar9 + -1;
                    lVar15 = lVar15 + -0x100000000;
                  } while (0 < lVar9);
                  uVar21 = 0xffffffffffffffff;
                  pcVar20 = pcVar19;
                  pcVar25 = pcVar24;
                  pcVar29 = pcVar28;
                }
              }
              else {
                lVar9 = ((long)uVar21 % lVar8 + uVar26 * lVar8) * uVar14 + (long)uVar21 / lVar8;
                if (cVar12 == '\x01') {
                  *pcVar28 = '-';
                  *pcVar19 = seqB[uVar26];
                  *pcVar24 = ' ';
                  uVar26 = uVar26 - 1;
                  iVar7 = 0;
                  cVar12 = '\x04';
                  pcVar20 = pcVar19 + 1;
                  pcVar25 = pcVar24 + 1;
                  pcVar29 = pcVar28 + 1;
                  if (((*(ulong *)(piVar5 + lVar9 * 2) & 8) == 0) &&
                     (cVar12 = '\x01', (*(ulong *)(piVar5 + lVar9 * 2) & 0x10) == 0)) {
                    parasail_result_get_traceback_extra_cold_19();
                    cVar12 = '\x01';
LAB_00548df6:
                    iVar7 = 1;
                    pcVar20 = pcVar19 + 1;
                    pcVar25 = pcVar24 + 1;
                    pcVar29 = pcVar28 + 1;
                  }
                }
                else {
                  iVar7 = (int)uVar21;
                  if (cVar12 == '\x02') {
                    if (seqA == (char *)0x0) {
                      cVar12 = '*';
                    }
                    else {
                      cVar12 = seqA[iVar7];
                    }
                    *pcVar28 = cVar12;
                    *pcVar19 = '-';
                    *pcVar24 = ' ';
                    uVar21 = uVar21 - 1;
                    iVar7 = 0;
                    cVar12 = '\x04';
                    pcVar20 = pcVar19 + 1;
                    pcVar25 = pcVar24 + 1;
                    pcVar29 = pcVar28 + 1;
                    if (((*(ulong *)(piVar5 + lVar9 * 2) & 0x20) == 0) &&
                       (cVar12 = '\x02', (*(ulong *)(piVar5 + lVar9 * 2) & 0x40) == 0)) {
                      parasail_result_get_traceback_extra_cold_18();
                      goto LAB_00548df6;
                    }
                  }
                  else if (cVar12 == '\x04') {
                    uVar6 = *(ulong *)(piVar5 + lVar9 * 2);
                    if ((uVar6 & 4) == 0) {
                      if ((uVar6 & 1) == 0) {
                        bVar30 = (uVar6 & 2) == 0;
                        cVar12 = bVar30 * '\x02' + '\x02';
                        iVar7 = 0;
                        if (bVar30) {
                          iVar7 = 0xe;
                        }
                      }
                      else {
                        iVar7 = 0;
                        cVar12 = '\x01';
                      }
                    }
                    else {
                      bVar22 = 0x2a;
                      cVar12 = '*';
                      if (seqA != (char *)0x0) {
                        cVar12 = seqA[iVar7];
                      }
                      *pcVar28 = cVar12;
                      *pcVar19 = seqB[uVar26];
                      if (seqA != (char *)0x0) {
                        bVar22 = seqA[iVar7];
                      }
                      bVar1 = seqB[uVar26 & 0xffffffff];
                      if (case_sensitive == 0) {
                        pp_Var10 = __ctype_toupper_loc();
                        bVar30 = (*pp_Var10)[(char)bVar22] == (*pp_Var10)[(char)bVar1];
                      }
                      else {
                        bVar30 = bVar22 == bVar1;
                      }
                      if (sVar23 != 0) {
                        sVar27 = 0;
                        do {
                          if (abStack_138[sVar27] == bVar22) {
                            bVar30 = (bool)(bVar30 | abStack_138[sVar27 + 1] == bVar1);
                          }
                          else if (abStack_138[sVar27 + 1] == bVar22) {
                            bVar30 = (bool)(bVar30 | abStack_138[sVar27] == bVar1);
                          }
                          sVar27 = sVar27 + 1;
                        } while (sVar23 != sVar27);
                      }
                      cVar12 = match;
                      if (!bVar30) {
                        if (matrix->type == 0) {
                          piVar16 = matrix->mapper;
                          iVar7 = matrix->size * piVar16[bVar22];
                        }
                        else {
                          iVar7 = matrix->size * iVar7;
                          piVar16 = matrix->mapper;
                        }
                        cVar12 = neg;
                        if (0 < matrix->matrix[iVar7 + piVar16[bVar1]]) {
                          cVar12 = pos;
                        }
                      }
                      *pcVar24 = cVar12;
                      uVar21 = uVar21 - 1;
                      uVar26 = uVar26 - 1;
                      iVar7 = 0;
                      cVar12 = '\x04';
                      pcVar20 = pcVar19 + 1;
                      pcVar25 = pcVar24 + 1;
                      pcVar29 = pcVar28 + 1;
                    }
                  }
                  else {
                    parasail_result_get_traceback_extra_cold_20();
                    iVar7 = 1;
                    cVar12 = '\x03';
                  }
                }
              }
              pcVar19 = pcVar20;
              pcVar24 = pcVar25;
              pcVar28 = pcVar29;
            } while (iVar7 == 0);
          }
          else {
            sVar23 = (size_t)(lena + lenb + 1);
            local_180 = (char *)malloc(sVar23);
            local_188 = (char *)malloc(sVar23);
            local_190 = (char *)malloc(sVar23);
            iVar7 = result->end_query;
            uVar21 = (ulong)iVar7;
            iVar4 = result->end_ref;
            uVar26 = (ulong)iVar4;
            uVar18 = 2;
            if ((uVar3 >> 0x19 & 1) == 0) {
              uVar18 = uVar3 >> 0x18 & 1;
            }
            uVar13 = 4;
            if ((uVar3 >> 0x1a & 1) == 0) {
              uVar13 = uVar18;
            }
            uVar18 = 8;
            if ((uVar3 >> 0x1b & 1) == 0) {
              uVar18 = uVar13;
            }
            uVar13 = 0x10;
            if ((uVar3 >> 0x1c & 1) == 0) {
              uVar13 = uVar18;
            }
            uVar18 = 0x20;
            if ((uVar3 >> 0x1d & 1) == 0) {
              uVar18 = uVar13;
            }
            uVar14 = 0x40;
            if ((uVar3 >> 0x1e & 1) == 0) {
              uVar14 = (ulong)uVar18;
            }
            piVar5 = ((result->field_4).rowcols)->score_row;
            lVar8 = (long)((long)lena + uVar14 + -1) / (long)uVar14;
            if (alphabet_aliases == (char *)0x0) {
              sVar23 = 0;
            }
            else {
              sVar23 = strlen(alphabet_aliases);
              if ((sVar23 & 0xffffffffffffff01) == 0) {
                if (sVar23 != 0) {
                  sVar27 = 0;
                  do {
                    if (case_sensitive == 0) {
                      pp_Var10 = __ctype_toupper_loc();
                      bVar22 = *(byte *)(*pp_Var10 + alphabet_aliases[sVar27]);
                    }
                    else {
                      bVar22 = alphabet_aliases[sVar27];
                    }
                    abStack_138[sVar27] = bVar22;
                    sVar27 = sVar27 + 1;
                  } while (sVar23 != sVar27);
                }
              }
              else {
                parasail_result_get_traceback_extra_cold_11();
              }
              if ((sVar23 & 0xffffffffffffff01) != 0) goto LAB_00548fcd;
            }
            pcVar19 = local_188;
            pcVar24 = local_190;
            pcVar28 = local_180;
            if ((result->flag & 2) != 0) {
              if (result->end_query + 1 == lena) {
                bVar30 = true;
                if (iVar4 < lenb + -1) {
                  sVar27 = (ulong)((lenb - iVar4) - 2) + 1;
                  memset(local_180,0x2d,sVar27);
                  memset(local_190,0x20,sVar27);
                  lVar15 = (long)(lenb + -1);
                  lVar9 = lVar15 - uVar26;
                  do {
                    *pcVar19 = seqB[lVar15];
                    pcVar19 = pcVar19 + 1;
                    lVar15 = lVar15 + -1;
                  } while ((long)uVar26 < lVar15);
                  pcVar24 = local_190 + lVar9;
                  pcVar28 = local_180 + lVar9;
                  bVar30 = true;
                }
              }
              else if (result->end_ref + 1 == lenb) {
                bVar30 = true;
                if (iVar7 < lena + -1) {
                  lVar9 = (long)(lena + -1);
                  do {
                    if (seqA == (char *)0x0) {
                      cVar12 = '*';
                    }
                    else {
                      cVar12 = seqA[lVar9];
                    }
                    *pcVar28 = cVar12;
                    pcVar28 = pcVar28 + 1;
                    *pcVar19 = '-';
                    pcVar19 = pcVar19 + 1;
                    *pcVar24 = ' ';
                    pcVar24 = pcVar24 + 1;
                    lVar9 = lVar9 + -1;
                    bVar30 = true;
                  } while ((long)uVar21 < lVar9);
                }
              }
              else {
                parasail_result_get_traceback_extra_cold_12();
                bVar30 = false;
              }
              if (!bVar30) goto LAB_00548fcd;
            }
            cVar12 = '\x04';
            do {
              if ((long)(uVar21 & uVar26) < 0) goto LAB_00548f48;
              pcVar20 = pcVar19;
              pcVar25 = pcVar24;
              pcVar29 = pcVar28;
              if ((long)uVar21 < 0) {
                iVar7 = 0xe;
                if ((result->flag & 4) == 0 && -1 < (long)uVar26) {
                  lVar9 = uVar26 + 1;
                  do {
                    *pcVar28 = '-';
                    pcVar28 = pcVar28 + 1;
                    *pcVar19 = seqB[lVar9 + -1];
                    pcVar19 = pcVar19 + 1;
                    *pcVar24 = ' ';
                    pcVar24 = pcVar24 + 1;
                    lVar9 = lVar9 + -1;
                  } while (0 < lVar9);
                  uVar26 = 0xffffffffffffffff;
                  pcVar20 = pcVar19;
                  pcVar25 = pcVar24;
                  pcVar29 = pcVar28;
                }
              }
              else if ((long)uVar26 < 0) {
                iVar7 = 0xe;
                if ((-1 < (long)uVar21) && ((result->flag & 4U) == 0)) {
                  lVar9 = uVar21 + 1;
                  lVar15 = uVar21 << 0x20;
                  do {
                    if (seqA == (char *)0x0) {
                      cVar17 = '*';
                    }
                    else {
                      cVar17 = seqA[lVar15 >> 0x20];
                    }
                    *pcVar28 = cVar17;
                    pcVar28 = pcVar28 + 1;
                    *pcVar19 = '-';
                    pcVar19 = pcVar19 + 1;
                    *pcVar24 = ' ';
                    pcVar24 = pcVar24 + 1;
                    lVar9 = lVar9 + -1;
                    lVar15 = lVar15 + -0x100000000;
                  } while (0 < lVar9);
                  uVar21 = 0xffffffffffffffff;
                  pcVar20 = pcVar19;
                  pcVar25 = pcVar24;
                  pcVar29 = pcVar28;
                }
              }
              else {
                lVar9 = ((long)uVar21 % lVar8 + uVar26 * lVar8) * uVar14 + (long)uVar21 / lVar8;
                if (cVar12 == '\x01') {
                  *pcVar28 = '-';
                  *pcVar19 = seqB[uVar26];
                  *pcVar24 = ' ';
                  uVar26 = uVar26 - 1;
                  iVar7 = 0;
                  cVar12 = '\x04';
                  pcVar20 = pcVar19 + 1;
                  pcVar25 = pcVar24 + 1;
                  pcVar29 = pcVar28 + 1;
                  if (((piVar5[lVar9] & 8U) == 0) && (cVar12 = '\x01', (piVar5[lVar9] & 0x10U) == 0)
                     ) {
                    parasail_result_get_traceback_extra_cold_14();
                    cVar12 = '\x01';
LAB_005489e1:
                    iVar7 = 1;
                    pcVar20 = pcVar19 + 1;
                    pcVar25 = pcVar24 + 1;
                    pcVar29 = pcVar28 + 1;
                  }
                }
                else {
                  iVar7 = (int)uVar21;
                  if (cVar12 == '\x02') {
                    if (seqA == (char *)0x0) {
                      cVar12 = '*';
                    }
                    else {
                      cVar12 = seqA[iVar7];
                    }
                    *pcVar28 = cVar12;
                    *pcVar19 = '-';
                    *pcVar24 = ' ';
                    uVar21 = uVar21 - 1;
                    iVar7 = 0;
                    cVar12 = '\x04';
                    pcVar20 = pcVar19 + 1;
                    pcVar25 = pcVar24 + 1;
                    pcVar29 = pcVar28 + 1;
                    if (((piVar5[lVar9] & 0x20U) == 0) &&
                       (cVar12 = '\x02', (piVar5[lVar9] & 0x40U) == 0)) {
                      parasail_result_get_traceback_extra_cold_13();
                      goto LAB_005489e1;
                    }
                  }
                  else if (cVar12 == '\x04') {
                    uVar3 = piVar5[lVar9];
                    if ((uVar3 & 4) == 0) {
                      if ((uVar3 & 1) == 0) {
                        bVar30 = (uVar3 & 2) == 0;
                        cVar12 = bVar30 * '\x02' + '\x02';
                        iVar7 = 0;
                        if (bVar30) {
                          iVar7 = 0xe;
                        }
                      }
                      else {
                        iVar7 = 0;
                        cVar12 = '\x01';
                      }
                    }
                    else {
                      bVar22 = 0x2a;
                      cVar12 = '*';
                      if (seqA != (char *)0x0) {
                        cVar12 = seqA[iVar7];
                      }
                      *pcVar28 = cVar12;
                      *pcVar19 = seqB[uVar26];
                      if (seqA != (char *)0x0) {
                        bVar22 = seqA[iVar7];
                      }
                      bVar1 = seqB[uVar26 & 0xffffffff];
                      if (case_sensitive == 0) {
                        pp_Var10 = __ctype_toupper_loc();
                        bVar30 = (*pp_Var10)[(char)bVar22] == (*pp_Var10)[(char)bVar1];
                      }
                      else {
                        bVar30 = bVar22 == bVar1;
                      }
                      if (sVar23 != 0) {
                        sVar27 = 0;
                        do {
                          if (abStack_138[sVar27] == bVar22) {
                            bVar30 = (bool)(bVar30 | abStack_138[sVar27 + 1] == bVar1);
                          }
                          else if (abStack_138[sVar27 + 1] == bVar22) {
                            bVar30 = (bool)(bVar30 | abStack_138[sVar27] == bVar1);
                          }
                          sVar27 = sVar27 + 1;
                        } while (sVar23 != sVar27);
                      }
                      cVar12 = match;
                      if (!bVar30) {
                        if (matrix->type == 0) {
                          piVar16 = matrix->mapper;
                          iVar7 = matrix->size * piVar16[bVar22];
                        }
                        else {
                          iVar7 = matrix->size * iVar7;
                          piVar16 = matrix->mapper;
                        }
                        cVar12 = neg;
                        if (0 < matrix->matrix[iVar7 + piVar16[bVar1]]) {
                          cVar12 = pos;
                        }
                      }
                      *pcVar24 = cVar12;
                      uVar21 = uVar21 - 1;
                      uVar26 = uVar26 - 1;
                      iVar7 = 0;
                      cVar12 = '\x04';
                      pcVar20 = pcVar19 + 1;
                      pcVar25 = pcVar24 + 1;
                      pcVar29 = pcVar28 + 1;
                    }
                  }
                  else {
                    parasail_result_get_traceback_extra_cold_15();
                    iVar7 = 1;
                    cVar12 = '\x03';
                  }
                }
              }
              pcVar19 = pcVar20;
              pcVar24 = pcVar25;
              pcVar28 = pcVar29;
            } while (iVar7 == 0);
          }
        }
        else {
          sVar23 = (size_t)(lena + lenb + 1);
          local_180 = (char *)malloc(sVar23);
          local_188 = (char *)malloc(sVar23);
          local_190 = (char *)malloc(sVar23);
          iVar7 = result->end_query;
          uVar21 = (ulong)iVar7;
          iVar4 = result->end_ref;
          uVar26 = (ulong)iVar4;
          uVar18 = 2;
          if ((uVar3 >> 0x19 & 1) == 0) {
            uVar18 = uVar3 >> 0x18 & 1;
          }
          uVar13 = 4;
          if ((uVar3 >> 0x1a & 1) == 0) {
            uVar13 = uVar18;
          }
          uVar18 = 8;
          if ((uVar3 >> 0x1b & 1) == 0) {
            uVar18 = uVar13;
          }
          uVar13 = 0x10;
          if ((uVar3 >> 0x1c & 1) == 0) {
            uVar13 = uVar18;
          }
          uVar18 = 0x20;
          if ((uVar3 >> 0x1d & 1) == 0) {
            uVar18 = uVar13;
          }
          uVar14 = 0x40;
          if ((uVar3 >> 0x1e & 1) == 0) {
            uVar14 = (ulong)uVar18;
          }
          piVar5 = ((result->field_4).rowcols)->score_row;
          lVar8 = (long)((long)lena + uVar14 + -1) / (long)uVar14;
          if (alphabet_aliases == (char *)0x0) {
            sVar23 = 0;
          }
          else {
            sVar23 = strlen(alphabet_aliases);
            if ((sVar23 & 0xffffffffffffff01) == 0) {
              if (sVar23 != 0) {
                sVar27 = 0;
                do {
                  if (case_sensitive == 0) {
                    pp_Var10 = __ctype_toupper_loc();
                    bVar22 = *(byte *)(*pp_Var10 + alphabet_aliases[sVar27]);
                  }
                  else {
                    bVar22 = alphabet_aliases[sVar27];
                  }
                  abStack_138[sVar27] = bVar22;
                  sVar27 = sVar27 + 1;
                } while (sVar23 != sVar27);
              }
            }
            else {
              parasail_result_get_traceback_extra_cold_6();
            }
            if ((sVar23 & 0xffffffffffffff01) != 0) goto LAB_00548fcd;
          }
          pcVar19 = local_188;
          pcVar24 = local_190;
          pcVar28 = local_180;
          if ((result->flag & 2) != 0) {
            if (result->end_query + 1 == lena) {
              bVar30 = true;
              if (iVar4 < lenb + -1) {
                sVar27 = (ulong)((lenb - iVar4) - 2) + 1;
                memset(local_180,0x2d,sVar27);
                memset(local_190,0x20,sVar27);
                lVar15 = (long)(lenb + -1);
                lVar9 = lVar15 - uVar26;
                do {
                  *pcVar19 = seqB[lVar15];
                  pcVar19 = pcVar19 + 1;
                  lVar15 = lVar15 + -1;
                } while ((long)uVar26 < lVar15);
                pcVar24 = local_190 + lVar9;
                pcVar28 = local_180 + lVar9;
                bVar30 = true;
              }
            }
            else if (result->end_ref + 1 == lenb) {
              bVar30 = true;
              if (iVar7 < lena + -1) {
                lVar9 = (long)(lena + -1);
                do {
                  if (seqA == (char *)0x0) {
                    cVar12 = '*';
                  }
                  else {
                    cVar12 = seqA[lVar9];
                  }
                  *pcVar28 = cVar12;
                  pcVar28 = pcVar28 + 1;
                  *pcVar19 = '-';
                  pcVar19 = pcVar19 + 1;
                  *pcVar24 = ' ';
                  pcVar24 = pcVar24 + 1;
                  lVar9 = lVar9 + -1;
                  bVar30 = true;
                } while ((long)uVar21 < lVar9);
              }
            }
            else {
              parasail_result_get_traceback_extra_cold_7();
              bVar30 = false;
            }
            if (!bVar30) goto LAB_00548fcd;
          }
          cVar12 = '\x04';
          do {
            if ((long)(uVar21 & uVar26) < 0) goto LAB_00548f48;
            pcVar20 = pcVar19;
            pcVar25 = pcVar24;
            pcVar29 = pcVar28;
            if ((long)uVar21 < 0) {
              iVar7 = 0xe;
              if ((result->flag & 4) == 0 && -1 < (long)uVar26) {
                lVar9 = uVar26 + 1;
                do {
                  *pcVar28 = '-';
                  pcVar28 = pcVar28 + 1;
                  *pcVar19 = seqB[lVar9 + -1];
                  pcVar19 = pcVar19 + 1;
                  *pcVar24 = ' ';
                  pcVar24 = pcVar24 + 1;
                  lVar9 = lVar9 + -1;
                } while (0 < lVar9);
                uVar26 = 0xffffffffffffffff;
                pcVar20 = pcVar19;
                pcVar25 = pcVar24;
                pcVar29 = pcVar28;
              }
            }
            else if ((long)uVar26 < 0) {
              iVar7 = 0xe;
              if ((-1 < (long)uVar21) && ((result->flag & 4U) == 0)) {
                lVar9 = uVar21 + 1;
                lVar15 = uVar21 << 0x20;
                do {
                  if (seqA == (char *)0x0) {
                    cVar17 = '*';
                  }
                  else {
                    cVar17 = seqA[lVar15 >> 0x20];
                  }
                  *pcVar28 = cVar17;
                  pcVar28 = pcVar28 + 1;
                  *pcVar19 = '-';
                  pcVar19 = pcVar19 + 1;
                  *pcVar24 = ' ';
                  pcVar24 = pcVar24 + 1;
                  lVar9 = lVar9 + -1;
                  lVar15 = lVar15 + -0x100000000;
                } while (0 < lVar9);
                uVar21 = 0xffffffffffffffff;
                pcVar20 = pcVar19;
                pcVar25 = pcVar24;
                pcVar29 = pcVar28;
              }
            }
            else {
              lVar9 = ((long)uVar21 % lVar8 + uVar26 * lVar8) * uVar14 + (long)uVar21 / lVar8;
              if (cVar12 == '\x01') {
                *pcVar28 = '-';
                *pcVar19 = seqB[uVar26];
                *pcVar24 = ' ';
                uVar26 = uVar26 - 1;
                uVar2 = *(ushort *)((long)piVar5 + lVar9 * 2);
                iVar7 = 0;
                cVar12 = '\x04';
                pcVar20 = pcVar19 + 1;
                pcVar25 = pcVar24 + 1;
                pcVar29 = pcVar28 + 1;
                if (((uVar2 & 8) == 0) && (cVar12 = '\x01', (uVar2 & 0x10) == 0)) {
                  parasail_result_get_traceback_extra_cold_9();
                  cVar12 = '\x01';
LAB_005485cf:
                  iVar7 = 1;
                  pcVar20 = pcVar19 + 1;
                  pcVar25 = pcVar24 + 1;
                  pcVar29 = pcVar28 + 1;
                }
              }
              else {
                iVar7 = (int)uVar21;
                if (cVar12 == '\x02') {
                  if (seqA == (char *)0x0) {
                    cVar12 = '*';
                  }
                  else {
                    cVar12 = seqA[iVar7];
                  }
                  *pcVar28 = cVar12;
                  *pcVar19 = '-';
                  *pcVar24 = ' ';
                  uVar21 = uVar21 - 1;
                  uVar2 = *(ushort *)((long)piVar5 + lVar9 * 2);
                  iVar7 = 0;
                  cVar12 = '\x04';
                  pcVar20 = pcVar19 + 1;
                  pcVar25 = pcVar24 + 1;
                  pcVar29 = pcVar28 + 1;
                  if (((uVar2 & 0x20) == 0) && (cVar12 = '\x02', (uVar2 & 0x40) == 0)) {
                    parasail_result_get_traceback_extra_cold_8();
                    goto LAB_005485cf;
                  }
                }
                else if (cVar12 == '\x04') {
                  uVar2 = *(ushort *)((long)piVar5 + lVar9 * 2);
                  if ((uVar2 & 4) == 0) {
                    if ((uVar2 & 1) == 0) {
                      bVar30 = (uVar2 & 2) == 0;
                      cVar12 = bVar30 * '\x02' + '\x02';
                      iVar7 = 0;
                      if (bVar30) {
                        iVar7 = 0xe;
                      }
                    }
                    else {
                      iVar7 = 0;
                      cVar12 = '\x01';
                    }
                  }
                  else {
                    bVar22 = 0x2a;
                    cVar12 = '*';
                    if (seqA != (char *)0x0) {
                      cVar12 = seqA[iVar7];
                    }
                    *pcVar28 = cVar12;
                    *pcVar19 = seqB[uVar26];
                    if (seqA != (char *)0x0) {
                      bVar22 = seqA[iVar7];
                    }
                    bVar1 = seqB[uVar26 & 0xffffffff];
                    if (case_sensitive == 0) {
                      pp_Var10 = __ctype_toupper_loc();
                      bVar30 = (*pp_Var10)[(char)bVar22] == (*pp_Var10)[(char)bVar1];
                    }
                    else {
                      bVar30 = bVar22 == bVar1;
                    }
                    if (sVar23 != 0) {
                      sVar27 = 0;
                      do {
                        if (abStack_138[sVar27] == bVar22) {
                          bVar30 = (bool)(bVar30 | abStack_138[sVar27 + 1] == bVar1);
                        }
                        else if (abStack_138[sVar27 + 1] == bVar22) {
                          bVar30 = (bool)(bVar30 | abStack_138[sVar27] == bVar1);
                        }
                        sVar27 = sVar27 + 1;
                      } while (sVar23 != sVar27);
                    }
                    cVar12 = match;
                    if (!bVar30) {
                      if (matrix->type == 0) {
                        piVar16 = matrix->mapper;
                        iVar7 = matrix->size * piVar16[bVar22];
                      }
                      else {
                        iVar7 = matrix->size * iVar7;
                        piVar16 = matrix->mapper;
                      }
                      cVar12 = neg;
                      if (0 < matrix->matrix[iVar7 + piVar16[bVar1]]) {
                        cVar12 = pos;
                      }
                    }
                    *pcVar24 = cVar12;
                    uVar21 = uVar21 - 1;
                    uVar26 = uVar26 - 1;
                    iVar7 = 0;
                    cVar12 = '\x04';
                    pcVar20 = pcVar19 + 1;
                    pcVar25 = pcVar24 + 1;
                    pcVar29 = pcVar28 + 1;
                  }
                }
                else {
                  parasail_result_get_traceback_extra_cold_10();
                  iVar7 = 1;
                  cVar12 = '\x03';
                }
              }
            }
            pcVar19 = pcVar20;
            pcVar24 = pcVar25;
            pcVar28 = pcVar29;
          } while (iVar7 == 0);
        }
      }
      else {
        sVar23 = (size_t)(lena + lenb + 1);
        local_180 = (char *)malloc(sVar23);
        local_188 = (char *)malloc(sVar23);
        local_190 = (char *)malloc(sVar23);
        iVar7 = result->end_query;
        uVar21 = (ulong)iVar7;
        iVar4 = result->end_ref;
        uVar26 = (ulong)iVar4;
        uVar18 = 2;
        if ((uVar3 >> 0x19 & 1) == 0) {
          uVar18 = uVar3 >> 0x18 & 1;
        }
        uVar13 = 4;
        if ((uVar3 >> 0x1a & 1) == 0) {
          uVar13 = uVar18;
        }
        uVar18 = 8;
        if ((uVar3 >> 0x1b & 1) == 0) {
          uVar18 = uVar13;
        }
        uVar13 = 0x10;
        if ((uVar3 >> 0x1c & 1) == 0) {
          uVar13 = uVar18;
        }
        uVar18 = 0x20;
        if ((uVar3 >> 0x1d & 1) == 0) {
          uVar18 = uVar13;
        }
        uVar14 = 0x40;
        if ((uVar3 >> 0x1e & 1) == 0) {
          uVar14 = (ulong)uVar18;
        }
        piVar5 = ((result->field_4).rowcols)->score_row;
        lVar8 = (long)((long)lena + uVar14 + -1) / (long)uVar14;
        if (alphabet_aliases == (char *)0x0) {
          sVar23 = 0;
        }
        else {
          sVar23 = strlen(alphabet_aliases);
          if ((sVar23 & 0xffffffffffffff01) == 0) {
            if (sVar23 != 0) {
              sVar27 = 0;
              do {
                if (case_sensitive == 0) {
                  pp_Var10 = __ctype_toupper_loc();
                  bVar22 = *(byte *)(*pp_Var10 + alphabet_aliases[sVar27]);
                }
                else {
                  bVar22 = alphabet_aliases[sVar27];
                }
                abStack_138[sVar27] = bVar22;
                sVar27 = sVar27 + 1;
              } while (sVar23 != sVar27);
            }
          }
          else {
            parasail_result_get_traceback_extra_cold_1();
          }
          if ((sVar23 & 0xffffffffffffff01) != 0) goto LAB_00548fcd;
        }
        pcVar19 = local_188;
        pcVar24 = local_190;
        pcVar28 = local_180;
        if ((result->flag & 2) != 0) {
          if (result->end_query + 1 == lena) {
            bVar30 = true;
            if (iVar4 < lenb + -1) {
              sVar27 = (ulong)((lenb - iVar4) - 2) + 1;
              memset(local_180,0x2d,sVar27);
              memset(local_190,0x20,sVar27);
              lVar15 = (long)(lenb + -1);
              lVar9 = lVar15 - uVar26;
              do {
                *pcVar19 = seqB[lVar15];
                pcVar19 = pcVar19 + 1;
                lVar15 = lVar15 + -1;
              } while ((long)uVar26 < lVar15);
              pcVar24 = local_190 + lVar9;
              pcVar28 = local_180 + lVar9;
              bVar30 = true;
            }
          }
          else if (result->end_ref + 1 == lenb) {
            bVar30 = true;
            if (iVar7 < lena + -1) {
              lVar9 = (long)(lena + -1);
              do {
                if (seqA == (char *)0x0) {
                  cVar12 = '*';
                }
                else {
                  cVar12 = seqA[lVar9];
                }
                *pcVar28 = cVar12;
                pcVar28 = pcVar28 + 1;
                *pcVar19 = '-';
                pcVar19 = pcVar19 + 1;
                *pcVar24 = ' ';
                pcVar24 = pcVar24 + 1;
                lVar9 = lVar9 + -1;
                bVar30 = true;
              } while ((long)uVar21 < lVar9);
            }
          }
          else {
            parasail_result_get_traceback_extra_cold_2();
            bVar30 = false;
          }
          if (!bVar30) goto LAB_00548fcd;
        }
        cVar12 = '\x04';
        do {
          if ((long)(uVar21 & uVar26) < 0) goto LAB_00548f48;
          pcVar20 = pcVar19;
          pcVar25 = pcVar24;
          pcVar29 = pcVar28;
          if ((long)uVar21 < 0) {
            iVar7 = 0xe;
            if ((result->flag & 4) == 0 && -1 < (long)uVar26) {
              lVar9 = uVar26 + 1;
              do {
                *pcVar28 = '-';
                pcVar28 = pcVar28 + 1;
                *pcVar19 = seqB[lVar9 + -1];
                pcVar19 = pcVar19 + 1;
                *pcVar24 = ' ';
                pcVar24 = pcVar24 + 1;
                lVar9 = lVar9 + -1;
              } while (0 < lVar9);
              uVar26 = 0xffffffffffffffff;
              pcVar20 = pcVar19;
              pcVar25 = pcVar24;
              pcVar29 = pcVar28;
            }
          }
          else if ((long)uVar26 < 0) {
            iVar7 = 0xe;
            if ((-1 < (long)uVar21) && ((result->flag & 4U) == 0)) {
              lVar9 = uVar21 + 1;
              lVar15 = uVar21 << 0x20;
              do {
                if (seqA == (char *)0x0) {
                  cVar17 = '*';
                }
                else {
                  cVar17 = seqA[lVar15 >> 0x20];
                }
                *pcVar28 = cVar17;
                pcVar28 = pcVar28 + 1;
                *pcVar19 = '-';
                pcVar19 = pcVar19 + 1;
                *pcVar24 = ' ';
                pcVar24 = pcVar24 + 1;
                lVar9 = lVar9 + -1;
                lVar15 = lVar15 + -0x100000000;
              } while (0 < lVar9);
              uVar21 = 0xffffffffffffffff;
              pcVar20 = pcVar19;
              pcVar25 = pcVar24;
              pcVar29 = pcVar28;
            }
          }
          else {
            lVar9 = ((long)uVar21 % lVar8 + uVar26 * lVar8) * uVar14 + (long)uVar21 / lVar8;
            if (cVar12 == '\x01') {
              *pcVar28 = '-';
              *pcVar19 = seqB[uVar26];
              *pcVar24 = ' ';
              uVar26 = uVar26 - 1;
              iVar7 = 0;
              cVar12 = '\x04';
              pcVar20 = pcVar19 + 1;
              pcVar25 = pcVar24 + 1;
              pcVar29 = pcVar28 + 1;
              if (((*(byte *)((long)piVar5 + lVar9) & 8) == 0) &&
                 (cVar12 = '\x01', (*(byte *)((long)piVar5 + lVar9) & 0x10) == 0)) {
                parasail_result_get_traceback_extra_cold_4();
                cVar12 = '\x01';
LAB_0054819b:
                iVar7 = 1;
                pcVar20 = pcVar19 + 1;
                pcVar25 = pcVar24 + 1;
                pcVar29 = pcVar28 + 1;
              }
            }
            else {
              iVar7 = (int)uVar21;
              if (cVar12 == '\x02') {
                if (seqA == (char *)0x0) {
                  cVar12 = '*';
                }
                else {
                  cVar12 = seqA[iVar7];
                }
                *pcVar28 = cVar12;
                *pcVar19 = '-';
                *pcVar24 = ' ';
                uVar21 = uVar21 - 1;
                iVar7 = 0;
                cVar12 = '\x04';
                pcVar20 = pcVar19 + 1;
                pcVar25 = pcVar24 + 1;
                pcVar29 = pcVar28 + 1;
                if (((*(byte *)((long)piVar5 + lVar9) & 0x20) == 0) &&
                   (cVar12 = '\x02', (*(byte *)((long)piVar5 + lVar9) & 0x40) == 0)) {
                  parasail_result_get_traceback_extra_cold_3();
                  goto LAB_0054819b;
                }
              }
              else if (cVar12 == '\x04') {
                bVar22 = *(byte *)((long)piVar5 + lVar9);
                if ((bVar22 & 4) == 0) {
                  if ((bVar22 & 1) == 0) {
                    bVar30 = (bVar22 & 2) == 0;
                    cVar12 = bVar30 * '\x02' + '\x02';
                    iVar7 = 0;
                    if (bVar30) {
                      iVar7 = 0xe;
                    }
                  }
                  else {
                    iVar7 = 0;
                    cVar12 = '\x01';
                  }
                }
                else {
                  bVar22 = 0x2a;
                  cVar12 = '*';
                  if (seqA != (char *)0x0) {
                    cVar12 = seqA[iVar7];
                  }
                  *pcVar28 = cVar12;
                  *pcVar19 = seqB[uVar26];
                  if (seqA != (char *)0x0) {
                    bVar22 = seqA[iVar7];
                  }
                  bVar1 = seqB[uVar26 & 0xffffffff];
                  if (case_sensitive == 0) {
                    pp_Var10 = __ctype_toupper_loc();
                    bVar30 = (*pp_Var10)[(char)bVar22] == (*pp_Var10)[(char)bVar1];
                  }
                  else {
                    bVar30 = bVar22 == bVar1;
                  }
                  if (sVar23 != 0) {
                    sVar27 = 0;
                    do {
                      if (abStack_138[sVar27] == bVar22) {
                        bVar30 = (bool)(bVar30 | abStack_138[sVar27 + 1] == bVar1);
                      }
                      else if (abStack_138[sVar27 + 1] == bVar22) {
                        bVar30 = (bool)(bVar30 | abStack_138[sVar27] == bVar1);
                      }
                      sVar27 = sVar27 + 1;
                    } while (sVar23 != sVar27);
                  }
                  cVar12 = match;
                  if (!bVar30) {
                    if (matrix->type == 0) {
                      piVar16 = matrix->mapper;
                      iVar7 = matrix->size * piVar16[bVar22];
                    }
                    else {
                      iVar7 = matrix->size * iVar7;
                      piVar16 = matrix->mapper;
                    }
                    cVar12 = neg;
                    if (0 < matrix->matrix[iVar7 + piVar16[bVar1]]) {
                      cVar12 = pos;
                    }
                  }
                  *pcVar24 = cVar12;
                  uVar21 = uVar21 - 1;
                  uVar26 = uVar26 - 1;
                  iVar7 = 0;
                  cVar12 = '\x04';
                  pcVar20 = pcVar19 + 1;
                  pcVar25 = pcVar24 + 1;
                  pcVar29 = pcVar28 + 1;
                }
              }
              else {
                parasail_result_get_traceback_extra_cold_5();
                iVar7 = 1;
                cVar12 = '\x03';
              }
            }
          }
          pcVar19 = pcVar20;
          pcVar24 = pcVar25;
          pcVar28 = pcVar29;
        } while (iVar7 == 0);
      }
      pcVar19 = pcVar20;
      pcVar24 = pcVar25;
      pcVar28 = pcVar29;
      if (iVar7 != 0xe) goto LAB_00548fcd;
LAB_00548f48:
      *pcVar28 = '\0';
      *pcVar19 = '\0';
      *pcVar24 = '\0';
      ppVar11 = (parasail_traceback_t *)malloc(0x18);
      sVar23 = strlen(local_180);
      pcVar19 = parasail_reverse(local_180,sVar23);
      ppVar11->query = pcVar19;
      sVar23 = strlen(local_190);
      pcVar19 = parasail_reverse(local_190,sVar23);
      ppVar11->comp = pcVar19;
    }
    sVar23 = strlen(local_188);
    pcVar19 = parasail_reverse(local_188,sVar23);
    ppVar11->ref = pcVar19;
    free(local_180);
    free(local_188);
    free(local_190);
  }
  return ppVar11;
}

Assistant:

parasail_traceback_t* parasail_result_get_traceback_extra(
        parasail_result_t *result,
        const char *seqA,
        int lena,
        const char *seqB,
        int lenb,
        const parasail_matrix_t *matrix,
        char match, char pos, char neg,
        int case_sensitive,
        const char *alphabet_aliases)
{
    PARASAIL_ASSERT(parasail_result_is_trace(result));

    if (result->flag & PARASAIL_FLAG_STRIPED
            || result->flag & PARASAIL_FLAG_SCAN) {
        if (result->flag & PARASAIL_FLAG_BITS_8) {
            return parasail_result_get_traceback_striped_8(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_16) {
            return parasail_result_get_traceback_striped_16(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_32) {
            return parasail_result_get_traceback_striped_32(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_64) {
            return parasail_result_get_traceback_striped_64(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
    }
    else {
        return parasail_result_get_traceback_8(
                result, seqA, lena, seqB, lenb,
                matrix, match, pos, neg,
                case_sensitive, alphabet_aliases);
    }

    return NULL; /* unreachable */
}